

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFourAction.cpp
# Opt level: O0

ActionResults * __thiscall BlueRoomFourAction::Throw(BlueRoomFourAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *this_01;
  bool bVar3;
  allocator local_41;
  string local_40 [36];
  itemType local_1c;
  BlueRoomFourAction *local_18;
  BlueRoomFourAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  bVar3 = false;
  if (iVar1 == ROPE) {
    local_1c = ROPE;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_1c);
    iVar2 = ItemWrapper::getLocation(this_00);
    bVar3 = iVar2 != HIDDEN;
  }
  if (bVar3) {
    this_01 = (ActionResults *)operator_new(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "You comically try and toss the rope as far as you can. Being attached to the floor, it doesn\'t work well."
               ,&local_41);
    ActionResults::ActionResults(this_01,CURRENT,(string *)local_40);
    this_local = (BlueRoomFourAction *)this_01;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    this_local = (BlueRoomFourAction *)AbstractRoomAction::Throw(&this->super_AbstractRoomAction);
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults * BlueRoomFourAction::Throw() {
    if(commands->getMainItem() == ROPE && itemList->getValue(ROPE)->getLocation() != HIDDEN){
        return new ActionResults(CURRENT, "You comically try and toss the rope as far as you can. Being attached to the floor, it doesn't work well.");
    } else {
        return AbstractRoomAction::Throw();
    }
}